

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

void arkStep_DisableMSetup(void *arkode_mem)

{
  if ((arkode_mem != (void *)0x0) && (*(long *)((long)arkode_mem + 0xe8) != 0)) {
    *(undefined8 *)(*(long *)((long)arkode_mem + 0xe8) + 0x140) = 0;
  }
  return;
}

Assistant:

void arkStep_DisableMSetup(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  if (arkode_mem==NULL)  return;
  ark_mem = (ARKodeMem) arkode_mem;
  if (ark_mem->step_mem==NULL)  return;
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* nullify the msetup function pointer */
  step_mem->msetup = NULL;
}